

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_16,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::ObjectIntersectorK<16,_true>_>,_false>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [64];
  undefined4 uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  ulong uVar22;
  undefined1 auVar23 [64];
  AABBNodeMB4D *node1;
  ulong uVar24;
  RTCIntersectFunctionN p_Var25;
  ushort uVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  ulong *puVar32;
  undefined1 (*pauVar33) [64];
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  int iVar71;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar72 [64];
  vint<16> mask;
  NodeRef stack_node [241];
  vfloat<16> stack_near [241];
  uint local_4734;
  RTCIntersectFunctionNArguments local_4708;
  Geometry *local_46d8;
  undefined8 local_46d0;
  RTCIntersectArguments *local_46c8;
  undefined1 local_46c0 [64];
  undefined1 local_4680 [64];
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined1 local_45c0 [64];
  undefined1 local_4580 [64];
  undefined1 local_4540 [64];
  undefined1 local_4500 [64];
  undefined1 local_44c0 [64];
  undefined8 local_4450;
  ulong local_4448 [241];
  undefined1 local_3cc0 [64];
  undefined1 local_3c80 [64];
  undefined1 local_3c40 [15376];
  
  local_4448[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_4448[0] != 8) {
    auVar37 = vpternlogd_avx512f(in_ZMM1,in_ZMM1,in_ZMM1,0xff);
    auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar34 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar72,5);
    uVar31 = vpcmpeqd_avx512f(auVar37,(undefined1  [64])valid_i->field_0);
    uVar34 = uVar34 & uVar31;
    if ((ushort)uVar34 != 0) {
      auVar38 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
      auVar37 = *(undefined1 (*) [64])(ray + 0x100);
      auVar41 = *(undefined1 (*) [64])(ray + 0x140);
      auVar42 = *(undefined1 (*) [64])(ray + 0x180);
      auVar39 = vandps_avx512dq(auVar37,auVar38);
      auVar40 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
      uVar31 = vcmpps_avx512f(auVar39,auVar40,1);
      bVar4 = (bool)((byte)uVar31 & 1);
      iVar36 = auVar40._0_4_;
      auVar39._0_4_ = (uint)bVar4 * iVar36 | (uint)!bVar4 * auVar37._0_4_;
      bVar4 = (bool)((byte)(uVar31 >> 1) & 1);
      iVar57 = auVar40._4_4_;
      auVar39._4_4_ = (uint)bVar4 * iVar57 | (uint)!bVar4 * auVar37._4_4_;
      bVar4 = (bool)((byte)(uVar31 >> 2) & 1);
      iVar58 = auVar40._8_4_;
      auVar39._8_4_ = (uint)bVar4 * iVar58 | (uint)!bVar4 * auVar37._8_4_;
      bVar4 = (bool)((byte)(uVar31 >> 3) & 1);
      iVar59 = auVar40._12_4_;
      auVar39._12_4_ = (uint)bVar4 * iVar59 | (uint)!bVar4 * auVar37._12_4_;
      bVar4 = (bool)((byte)(uVar31 >> 4) & 1);
      iVar60 = auVar40._16_4_;
      auVar39._16_4_ = (uint)bVar4 * iVar60 | (uint)!bVar4 * auVar37._16_4_;
      bVar4 = (bool)((byte)(uVar31 >> 5) & 1);
      iVar61 = auVar40._20_4_;
      auVar39._20_4_ = (uint)bVar4 * iVar61 | (uint)!bVar4 * auVar37._20_4_;
      bVar4 = (bool)((byte)(uVar31 >> 6) & 1);
      iVar62 = auVar40._24_4_;
      auVar39._24_4_ = (uint)bVar4 * iVar62 | (uint)!bVar4 * auVar37._24_4_;
      bVar4 = (bool)((byte)(uVar31 >> 7) & 1);
      iVar63 = auVar40._28_4_;
      auVar39._28_4_ = (uint)bVar4 * iVar63 | (uint)!bVar4 * auVar37._28_4_;
      bVar4 = (bool)((byte)(uVar31 >> 8) & 1);
      iVar64 = auVar40._32_4_;
      auVar39._32_4_ = (uint)bVar4 * iVar64 | (uint)!bVar4 * auVar37._32_4_;
      bVar4 = (bool)((byte)(uVar31 >> 9) & 1);
      iVar65 = auVar40._36_4_;
      auVar39._36_4_ = (uint)bVar4 * iVar65 | (uint)!bVar4 * auVar37._36_4_;
      bVar4 = (bool)((byte)(uVar31 >> 10) & 1);
      iVar66 = auVar40._40_4_;
      auVar39._40_4_ = (uint)bVar4 * iVar66 | (uint)!bVar4 * auVar37._40_4_;
      bVar4 = (bool)((byte)(uVar31 >> 0xb) & 1);
      iVar67 = auVar40._44_4_;
      auVar39._44_4_ = (uint)bVar4 * iVar67 | (uint)!bVar4 * auVar37._44_4_;
      bVar4 = (bool)((byte)(uVar31 >> 0xc) & 1);
      iVar68 = auVar40._48_4_;
      auVar39._48_4_ = (uint)bVar4 * iVar68 | (uint)!bVar4 * auVar37._48_4_;
      bVar4 = (bool)((byte)(uVar31 >> 0xd) & 1);
      iVar69 = auVar40._52_4_;
      auVar39._52_4_ = (uint)bVar4 * iVar69 | (uint)!bVar4 * auVar37._52_4_;
      bVar4 = (bool)((byte)(uVar31 >> 0xe) & 1);
      iVar70 = auVar40._56_4_;
      iVar71 = auVar40._60_4_;
      auVar39._56_4_ = (uint)bVar4 * iVar70 | (uint)!bVar4 * auVar37._56_4_;
      bVar4 = SUB81(uVar31 >> 0xf,0);
      auVar39._60_4_ = (uint)bVar4 * iVar71 | (uint)!bVar4 * auVar37._60_4_;
      auVar37 = vandps_avx512dq(auVar41,auVar38);
      uVar31 = vcmpps_avx512f(auVar37,auVar40,1);
      bVar4 = (bool)((byte)uVar31 & 1);
      auVar37._0_4_ = (uint)bVar4 * iVar36 | (uint)!bVar4 * auVar41._0_4_;
      bVar4 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar37._4_4_ = (uint)bVar4 * iVar57 | (uint)!bVar4 * auVar41._4_4_;
      bVar4 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar37._8_4_ = (uint)bVar4 * iVar58 | (uint)!bVar4 * auVar41._8_4_;
      bVar4 = (bool)((byte)(uVar31 >> 3) & 1);
      auVar37._12_4_ = (uint)bVar4 * iVar59 | (uint)!bVar4 * auVar41._12_4_;
      bVar4 = (bool)((byte)(uVar31 >> 4) & 1);
      auVar37._16_4_ = (uint)bVar4 * iVar60 | (uint)!bVar4 * auVar41._16_4_;
      bVar4 = (bool)((byte)(uVar31 >> 5) & 1);
      auVar37._20_4_ = (uint)bVar4 * iVar61 | (uint)!bVar4 * auVar41._20_4_;
      bVar4 = (bool)((byte)(uVar31 >> 6) & 1);
      auVar37._24_4_ = (uint)bVar4 * iVar62 | (uint)!bVar4 * auVar41._24_4_;
      bVar4 = (bool)((byte)(uVar31 >> 7) & 1);
      auVar37._28_4_ = (uint)bVar4 * iVar63 | (uint)!bVar4 * auVar41._28_4_;
      bVar4 = (bool)((byte)(uVar31 >> 8) & 1);
      auVar37._32_4_ = (uint)bVar4 * iVar64 | (uint)!bVar4 * auVar41._32_4_;
      bVar4 = (bool)((byte)(uVar31 >> 9) & 1);
      auVar37._36_4_ = (uint)bVar4 * iVar65 | (uint)!bVar4 * auVar41._36_4_;
      bVar4 = (bool)((byte)(uVar31 >> 10) & 1);
      auVar37._40_4_ = (uint)bVar4 * iVar66 | (uint)!bVar4 * auVar41._40_4_;
      bVar4 = (bool)((byte)(uVar31 >> 0xb) & 1);
      auVar37._44_4_ = (uint)bVar4 * iVar67 | (uint)!bVar4 * auVar41._44_4_;
      bVar4 = (bool)((byte)(uVar31 >> 0xc) & 1);
      auVar37._48_4_ = (uint)bVar4 * iVar68 | (uint)!bVar4 * auVar41._48_4_;
      bVar4 = (bool)((byte)(uVar31 >> 0xd) & 1);
      auVar37._52_4_ = (uint)bVar4 * iVar69 | (uint)!bVar4 * auVar41._52_4_;
      bVar4 = (bool)((byte)(uVar31 >> 0xe) & 1);
      auVar37._56_4_ = (uint)bVar4 * iVar70 | (uint)!bVar4 * auVar41._56_4_;
      bVar4 = SUB81(uVar31 >> 0xf,0);
      auVar37._60_4_ = (uint)bVar4 * iVar71 | (uint)!bVar4 * auVar41._60_4_;
      auVar41 = vandps_avx512dq(auVar42,auVar38);
      uVar31 = vcmpps_avx512f(auVar41,auVar40,1);
      bVar4 = (bool)((byte)uVar31 & 1);
      auVar41._0_4_ = (uint)bVar4 * iVar36 | (uint)!bVar4 * auVar42._0_4_;
      bVar4 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar41._4_4_ = (uint)bVar4 * iVar57 | (uint)!bVar4 * auVar42._4_4_;
      bVar4 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar41._8_4_ = (uint)bVar4 * iVar58 | (uint)!bVar4 * auVar42._8_4_;
      bVar4 = (bool)((byte)(uVar31 >> 3) & 1);
      auVar41._12_4_ = (uint)bVar4 * iVar59 | (uint)!bVar4 * auVar42._12_4_;
      bVar4 = (bool)((byte)(uVar31 >> 4) & 1);
      auVar41._16_4_ = (uint)bVar4 * iVar60 | (uint)!bVar4 * auVar42._16_4_;
      bVar4 = (bool)((byte)(uVar31 >> 5) & 1);
      auVar41._20_4_ = (uint)bVar4 * iVar61 | (uint)!bVar4 * auVar42._20_4_;
      bVar4 = (bool)((byte)(uVar31 >> 6) & 1);
      auVar41._24_4_ = (uint)bVar4 * iVar62 | (uint)!bVar4 * auVar42._24_4_;
      bVar4 = (bool)((byte)(uVar31 >> 7) & 1);
      auVar41._28_4_ = (uint)bVar4 * iVar63 | (uint)!bVar4 * auVar42._28_4_;
      bVar4 = (bool)((byte)(uVar31 >> 8) & 1);
      auVar41._32_4_ = (uint)bVar4 * iVar64 | (uint)!bVar4 * auVar42._32_4_;
      bVar4 = (bool)((byte)(uVar31 >> 9) & 1);
      auVar41._36_4_ = (uint)bVar4 * iVar65 | (uint)!bVar4 * auVar42._36_4_;
      bVar4 = (bool)((byte)(uVar31 >> 10) & 1);
      auVar41._40_4_ = (uint)bVar4 * iVar66 | (uint)!bVar4 * auVar42._40_4_;
      bVar4 = (bool)((byte)(uVar31 >> 0xb) & 1);
      auVar41._44_4_ = (uint)bVar4 * iVar67 | (uint)!bVar4 * auVar42._44_4_;
      bVar4 = (bool)((byte)(uVar31 >> 0xc) & 1);
      auVar41._48_4_ = (uint)bVar4 * iVar68 | (uint)!bVar4 * auVar42._48_4_;
      bVar4 = (bool)((byte)(uVar31 >> 0xd) & 1);
      auVar41._52_4_ = (uint)bVar4 * iVar69 | (uint)!bVar4 * auVar42._52_4_;
      bVar4 = (bool)((byte)(uVar31 >> 0xe) & 1);
      auVar41._56_4_ = (uint)bVar4 * iVar70 | (uint)!bVar4 * auVar42._56_4_;
      bVar4 = SUB81(uVar31 >> 0xf,0);
      auVar41._60_4_ = (uint)bVar4 * iVar71 | (uint)!bVar4 * auVar42._60_4_;
      auVar40 = vrcp14ps_avx512f(auVar39);
      auVar42 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar38 = vrcp14ps_avx512f(auVar37);
      auVar43 = vrcp14ps_avx512f(auVar41);
      auVar39 = vfnmadd213ps_avx512f(auVar39,auVar40,auVar42);
      auVar37 = vfnmadd213ps_avx512f(auVar37,auVar38,auVar42);
      auVar44 = vfnmadd213ps_avx512f(auVar41,auVar43,auVar42);
      auVar45 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      auVar41 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar72);
      bVar4 = (bool)((byte)uVar34 & 1);
      auVar42._0_4_ = (uint)bVar4 * auVar41._0_4_ | (uint)!bVar4 * auVar45._0_4_;
      bVar4 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar4 * auVar41._4_4_ | (uint)!bVar4 * auVar45._4_4_;
      bVar4 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar4 * auVar41._8_4_ | (uint)!bVar4 * auVar45._8_4_;
      bVar4 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar42._12_4_ = (uint)bVar4 * auVar41._12_4_ | (uint)!bVar4 * auVar45._12_4_;
      bVar4 = (bool)((byte)(uVar34 >> 4) & 1);
      auVar42._16_4_ = (uint)bVar4 * auVar41._16_4_ | (uint)!bVar4 * auVar45._16_4_;
      bVar4 = (bool)((byte)(uVar34 >> 5) & 1);
      auVar42._20_4_ = (uint)bVar4 * auVar41._20_4_ | (uint)!bVar4 * auVar45._20_4_;
      bVar4 = (bool)((byte)(uVar34 >> 6) & 1);
      auVar42._24_4_ = (uint)bVar4 * auVar41._24_4_ | (uint)!bVar4 * auVar45._24_4_;
      bVar4 = (bool)((byte)(uVar34 >> 7) & 1);
      auVar42._28_4_ = (uint)bVar4 * auVar41._28_4_ | (uint)!bVar4 * auVar45._28_4_;
      bVar12 = (byte)(uVar34 >> 8);
      bVar4 = (bool)(bVar12 & 1);
      auVar42._32_4_ = (uint)bVar4 * auVar41._32_4_ | (uint)!bVar4 * auVar45._32_4_;
      bVar4 = (bool)((byte)(uVar34 >> 9) & 1);
      auVar42._36_4_ = (uint)bVar4 * auVar41._36_4_ | (uint)!bVar4 * auVar45._36_4_;
      bVar4 = (bool)((byte)(uVar34 >> 10) & 1);
      auVar42._40_4_ = (uint)bVar4 * auVar41._40_4_ | (uint)!bVar4 * auVar45._40_4_;
      bVar4 = (bool)((byte)(uVar34 >> 0xb) & 1);
      auVar42._44_4_ = (uint)bVar4 * auVar41._44_4_ | (uint)!bVar4 * auVar45._44_4_;
      bVar4 = (bool)((byte)(uVar34 >> 0xc) & 1);
      auVar42._48_4_ = (uint)bVar4 * auVar41._48_4_ | (uint)!bVar4 * auVar45._48_4_;
      bVar4 = (bool)((byte)(uVar34 >> 0xd) & 1);
      auVar42._52_4_ = (uint)bVar4 * auVar41._52_4_ | (uint)!bVar4 * auVar45._52_4_;
      bVar4 = (bool)((byte)(uVar34 >> 0xe) & 1);
      auVar42._56_4_ = (uint)bVar4 * auVar41._56_4_ | (uint)!bVar4 * auVar45._56_4_;
      bVar4 = SUB81(uVar34 >> 0xf,0);
      auVar42._60_4_ = (uint)bVar4 * auVar41._60_4_ | (uint)!bVar4 * auVar45._60_4_;
      auVar41 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar46 = vxorps_avx512dq(auVar41,*(undefined1 (*) [64])ray);
      auVar47 = vxorps_avx512dq(auVar41,*(undefined1 (*) [64])(ray + 0x40));
      local_4734 = (uint)(ushort)~(ushort)uVar34;
      auVar48 = vxorps_avx512dq(auVar41,*(undefined1 (*) [64])(ray + 0x80));
      auVar41 = vfmadd132ps_avx512f(auVar37,auVar38,auVar38);
      auVar37 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      auVar72 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar72);
      bVar4 = (bool)((byte)uVar34 & 1);
      auVar38._0_4_ = (uint)bVar4 * auVar72._0_4_ | (uint)!bVar4 * auVar37._0_4_;
      bVar4 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar4 * auVar72._4_4_ | (uint)!bVar4 * auVar37._4_4_;
      bVar4 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar4 * auVar72._8_4_ | (uint)!bVar4 * auVar37._8_4_;
      bVar4 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar38._12_4_ = (uint)bVar4 * auVar72._12_4_ | (uint)!bVar4 * auVar37._12_4_;
      bVar4 = (bool)((byte)(uVar34 >> 4) & 1);
      auVar38._16_4_ = (uint)bVar4 * auVar72._16_4_ | (uint)!bVar4 * auVar37._16_4_;
      bVar4 = (bool)((byte)(uVar34 >> 5) & 1);
      auVar38._20_4_ = (uint)bVar4 * auVar72._20_4_ | (uint)!bVar4 * auVar37._20_4_;
      bVar4 = (bool)((byte)(uVar34 >> 6) & 1);
      auVar38._24_4_ = (uint)bVar4 * auVar72._24_4_ | (uint)!bVar4 * auVar37._24_4_;
      bVar4 = (bool)((byte)(uVar34 >> 7) & 1);
      auVar38._28_4_ = (uint)bVar4 * auVar72._28_4_ | (uint)!bVar4 * auVar37._28_4_;
      bVar4 = (bool)(bVar12 & 1);
      auVar38._32_4_ = (uint)bVar4 * auVar72._32_4_ | (uint)!bVar4 * auVar37._32_4_;
      bVar4 = (bool)((byte)(uVar34 >> 9) & 1);
      auVar38._36_4_ = (uint)bVar4 * auVar72._36_4_ | (uint)!bVar4 * auVar37._36_4_;
      bVar4 = (bool)((byte)(uVar34 >> 10) & 1);
      auVar38._40_4_ = (uint)bVar4 * auVar72._40_4_ | (uint)!bVar4 * auVar37._40_4_;
      bVar4 = (bool)((byte)(uVar34 >> 0xb) & 1);
      auVar38._44_4_ = (uint)bVar4 * auVar72._44_4_ | (uint)!bVar4 * auVar37._44_4_;
      bVar4 = (bool)((byte)(uVar34 >> 0xc) & 1);
      auVar38._48_4_ = (uint)bVar4 * auVar72._48_4_ | (uint)!bVar4 * auVar37._48_4_;
      bVar4 = (bool)((byte)(uVar34 >> 0xd) & 1);
      auVar38._52_4_ = (uint)bVar4 * auVar72._52_4_ | (uint)!bVar4 * auVar37._52_4_;
      bVar4 = (bool)((byte)(uVar34 >> 0xe) & 1);
      auVar38._56_4_ = (uint)bVar4 * auVar72._56_4_ | (uint)!bVar4 * auVar37._56_4_;
      bVar4 = SUB81(uVar34 >> 0xf,0);
      auVar38._60_4_ = (uint)bVar4 * auVar72._60_4_ | (uint)!bVar4 * auVar37._60_4_;
      auVar37 = vfmadd132ps_avx512f(auVar39,auVar40,auVar40);
      auVar72 = vfmadd132ps_avx512f(auVar44,auVar43,auVar43);
      puVar32 = local_4448 + 1;
      local_4450 = 0xfffffffffffffff8;
      pauVar33 = (undefined1 (*) [64])local_3c40;
      local_3c80 = auVar42;
      auVar39 = vmulps_avx512f(auVar37,auVar46);
      auVar40 = vmulps_avx512f(auVar41,auVar47);
      auVar43 = vmulps_avx512f(auVar72,auVar48);
      local_46c0 = auVar43;
      local_4680 = auVar40;
      local_4640 = auVar39;
      local_4600 = auVar42;
      local_45c0 = auVar72;
      local_4580 = auVar41;
      local_4540 = auVar37;
      local_3cc0 = auVar45;
LAB_01ebdb2e:
      uVar31 = puVar32[-1];
      if (uVar31 != 0xfffffffffffffff8) {
        puVar32 = puVar32 + -1;
        pauVar1 = pauVar33 + -1;
        pauVar33 = pauVar33 + -1;
        uVar21 = vcmpps_avx512f(*pauVar1,auVar38,1);
        auVar44 = *pauVar1;
        if ((short)uVar21 != 0) {
          do {
            uVar30 = (uint)uVar31;
            if ((uVar31 & 8) != 0) {
              if (uVar31 == 0xfffffffffffffff8) goto LAB_01ebde89;
              uVar21 = vcmpps_avx512f(auVar38,auVar44,6);
              if ((short)uVar21 != 0) {
                uVar28 = ~local_4734;
                lVar27 = 0;
                local_4500 = auVar38;
                goto LAB_01ebdd23;
              }
              break;
            }
            uVar24 = uVar31 & 0xfffffffffffffff0;
            uVar31 = 8;
            auVar46 = auVar45;
            for (lVar27 = -0x10;
                (lVar27 != 0 && (uVar3 = *(ulong *)(uVar24 + 0x20 + lVar27 * 2), uVar3 != 8));
                lVar27 = lVar27 + 4) {
              auVar49 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar24 + 0x90 + lVar27)));
              auVar47 = *(undefined1 (*) [64])(ray + 0x1c0);
              uVar2 = *(undefined4 *)(uVar24 + 0x30 + lVar27);
              auVar48._4_4_ = uVar2;
              auVar48._0_4_ = uVar2;
              auVar48._8_4_ = uVar2;
              auVar48._12_4_ = uVar2;
              auVar48._16_4_ = uVar2;
              auVar48._20_4_ = uVar2;
              auVar48._24_4_ = uVar2;
              auVar48._28_4_ = uVar2;
              auVar48._32_4_ = uVar2;
              auVar48._36_4_ = uVar2;
              auVar48._40_4_ = uVar2;
              auVar48._44_4_ = uVar2;
              auVar48._48_4_ = uVar2;
              auVar48._52_4_ = uVar2;
              auVar48._56_4_ = uVar2;
              auVar48._60_4_ = uVar2;
              auVar48 = vfmadd213ps_avx512f(auVar49,auVar47,auVar48);
              auVar50 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar24 + 0xb0 + lVar27)));
              uVar2 = *(undefined4 *)(uVar24 + 0x50 + lVar27);
              auVar49._4_4_ = uVar2;
              auVar49._0_4_ = uVar2;
              auVar49._8_4_ = uVar2;
              auVar49._12_4_ = uVar2;
              auVar49._16_4_ = uVar2;
              auVar49._20_4_ = uVar2;
              auVar49._24_4_ = uVar2;
              auVar49._28_4_ = uVar2;
              auVar49._32_4_ = uVar2;
              auVar49._36_4_ = uVar2;
              auVar49._40_4_ = uVar2;
              auVar49._44_4_ = uVar2;
              auVar49._48_4_ = uVar2;
              auVar49._52_4_ = uVar2;
              auVar49._56_4_ = uVar2;
              auVar49._60_4_ = uVar2;
              auVar49 = vfmadd213ps_avx512f(auVar50,auVar47,auVar49);
              auVar51 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar24 + 0xd0 + lVar27)));
              uVar2 = *(undefined4 *)(uVar24 + 0x70 + lVar27);
              auVar50._4_4_ = uVar2;
              auVar50._0_4_ = uVar2;
              auVar50._8_4_ = uVar2;
              auVar50._12_4_ = uVar2;
              auVar50._16_4_ = uVar2;
              auVar50._20_4_ = uVar2;
              auVar50._24_4_ = uVar2;
              auVar50._28_4_ = uVar2;
              auVar50._32_4_ = uVar2;
              auVar50._36_4_ = uVar2;
              auVar50._40_4_ = uVar2;
              auVar50._44_4_ = uVar2;
              auVar50._48_4_ = uVar2;
              auVar50._52_4_ = uVar2;
              auVar50._56_4_ = uVar2;
              auVar50._60_4_ = uVar2;
              auVar50 = vfmadd213ps_avx512f(auVar51,auVar47,auVar50);
              auVar52 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar24 + 0xa0 + lVar27)));
              uVar2 = *(undefined4 *)(uVar24 + 0x40 + lVar27);
              auVar51._4_4_ = uVar2;
              auVar51._0_4_ = uVar2;
              auVar51._8_4_ = uVar2;
              auVar51._12_4_ = uVar2;
              auVar51._16_4_ = uVar2;
              auVar51._20_4_ = uVar2;
              auVar51._24_4_ = uVar2;
              auVar51._28_4_ = uVar2;
              auVar51._32_4_ = uVar2;
              auVar51._36_4_ = uVar2;
              auVar51._40_4_ = uVar2;
              auVar51._44_4_ = uVar2;
              auVar51._48_4_ = uVar2;
              auVar51._52_4_ = uVar2;
              auVar51._56_4_ = uVar2;
              auVar51._60_4_ = uVar2;
              auVar51 = vfmadd213ps_avx512f(auVar52,auVar47,auVar51);
              auVar53 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar24 + 0xc0 + lVar27)));
              uVar2 = *(undefined4 *)(uVar24 + 0x60 + lVar27);
              auVar52._4_4_ = uVar2;
              auVar52._0_4_ = uVar2;
              auVar52._8_4_ = uVar2;
              auVar52._12_4_ = uVar2;
              auVar52._16_4_ = uVar2;
              auVar52._20_4_ = uVar2;
              auVar52._24_4_ = uVar2;
              auVar52._28_4_ = uVar2;
              auVar52._32_4_ = uVar2;
              auVar52._36_4_ = uVar2;
              auVar52._40_4_ = uVar2;
              auVar52._44_4_ = uVar2;
              auVar52._48_4_ = uVar2;
              auVar52._52_4_ = uVar2;
              auVar52._56_4_ = uVar2;
              auVar52._60_4_ = uVar2;
              auVar52 = vfmadd213ps_avx512f(auVar53,auVar47,auVar52);
              auVar54 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar24 + 0xe0 + lVar27)));
              uVar2 = *(undefined4 *)(uVar24 + 0x80 + lVar27);
              auVar53._4_4_ = uVar2;
              auVar53._0_4_ = uVar2;
              auVar53._8_4_ = uVar2;
              auVar53._12_4_ = uVar2;
              auVar53._16_4_ = uVar2;
              auVar53._20_4_ = uVar2;
              auVar53._24_4_ = uVar2;
              auVar53._28_4_ = uVar2;
              auVar53._32_4_ = uVar2;
              auVar53._36_4_ = uVar2;
              auVar53._40_4_ = uVar2;
              auVar53._44_4_ = uVar2;
              auVar53._48_4_ = uVar2;
              auVar53._52_4_ = uVar2;
              auVar53._56_4_ = uVar2;
              auVar53._60_4_ = uVar2;
              auVar53 = vfmadd213ps_avx512f(auVar54,auVar47,auVar53);
              auVar48 = vfmadd213ps_avx512f(auVar48,auVar37,auVar39);
              auVar49 = vfmadd213ps_avx512f(auVar49,auVar41,auVar40);
              auVar50 = vfmadd213ps_avx512f(auVar50,auVar72,auVar43);
              auVar51 = vfmadd213ps_avx512f(auVar51,auVar37,auVar39);
              auVar52 = vfmadd213ps_avx512f(auVar52,auVar41,auVar40);
              auVar53 = vfmadd213ps_avx512f(auVar53,auVar72,auVar43);
              auVar54 = vpminsd_avx512f(auVar48,auVar51);
              auVar55 = vpminsd_avx512f(auVar49,auVar52);
              auVar54 = vpmaxsd_avx512f(auVar54,auVar55);
              auVar55 = vpminsd_avx512f(auVar50,auVar53);
              auVar54 = vpmaxsd_avx512f(auVar54,auVar55);
              auVar48 = vpmaxsd_avx512f(auVar48,auVar51);
              auVar49 = vpmaxsd_avx512f(auVar49,auVar52);
              auVar48 = vpminsd_avx512f(auVar48,auVar49);
              auVar49 = vpmaxsd_avx512f(auVar50,auVar53);
              auVar50 = vpmaxsd_avx512f(auVar54,auVar42);
              auVar49 = vpminsd_avx512f(auVar49,auVar38);
              auVar48 = vpminsd_avx512f(auVar48,auVar49);
              uVar35 = vcmpps_avx512f(auVar50,auVar48,2);
              if ((uVar30 & 7) == 6) {
                uVar2 = *(undefined4 *)(uVar24 + 0xf0 + lVar27);
                auVar55._4_4_ = uVar2;
                auVar55._0_4_ = uVar2;
                auVar55._8_4_ = uVar2;
                auVar55._12_4_ = uVar2;
                auVar55._16_4_ = uVar2;
                auVar55._20_4_ = uVar2;
                auVar55._24_4_ = uVar2;
                auVar55._28_4_ = uVar2;
                auVar55._32_4_ = uVar2;
                auVar55._36_4_ = uVar2;
                auVar55._40_4_ = uVar2;
                auVar55._44_4_ = uVar2;
                auVar55._48_4_ = uVar2;
                auVar55._52_4_ = uVar2;
                auVar55._56_4_ = uVar2;
                auVar55._60_4_ = uVar2;
                uVar29 = vcmpps_avx512f(auVar47,auVar55,0xd);
                uVar2 = *(undefined4 *)(uVar24 + 0x100 + lVar27);
                auVar23._4_4_ = uVar2;
                auVar23._0_4_ = uVar2;
                auVar23._8_4_ = uVar2;
                auVar23._12_4_ = uVar2;
                auVar23._16_4_ = uVar2;
                auVar23._20_4_ = uVar2;
                auVar23._24_4_ = uVar2;
                auVar23._28_4_ = uVar2;
                auVar23._32_4_ = uVar2;
                auVar23._36_4_ = uVar2;
                auVar23._40_4_ = uVar2;
                auVar23._44_4_ = uVar2;
                auVar23._48_4_ = uVar2;
                auVar23._52_4_ = uVar2;
                auVar23._56_4_ = uVar2;
                auVar23._60_4_ = uVar2;
                uVar22 = vcmpps_avx512f(auVar47,auVar23,1);
                uVar35 = uVar35 & uVar29 & uVar22;
              }
              uVar29 = vcmpps_avx512f(auVar38,auVar44,6);
              uVar35 = uVar35 & uVar29;
              uVar29 = uVar31;
              auVar56 = auVar46;
              if ((short)uVar35 != 0) {
                auVar48 = vblendmps_avx512f(auVar45,auVar54);
                bVar4 = (bool)((byte)uVar35 & 1);
                auVar56._0_4_ = (uint)bVar4 * auVar48._0_4_ | (uint)!bVar4 * auVar47._0_4_;
                bVar4 = (bool)((byte)(uVar35 >> 1) & 1);
                auVar56._4_4_ = (uint)bVar4 * auVar48._4_4_ | (uint)!bVar4 * auVar47._4_4_;
                bVar4 = (bool)((byte)(uVar35 >> 2) & 1);
                auVar56._8_4_ = (uint)bVar4 * auVar48._8_4_ | (uint)!bVar4 * auVar47._8_4_;
                bVar4 = (bool)((byte)(uVar35 >> 3) & 1);
                auVar56._12_4_ = (uint)bVar4 * auVar48._12_4_ | (uint)!bVar4 * auVar47._12_4_;
                bVar4 = (bool)((byte)(uVar35 >> 4) & 1);
                auVar56._16_4_ = (uint)bVar4 * auVar48._16_4_ | (uint)!bVar4 * auVar47._16_4_;
                bVar4 = (bool)((byte)(uVar35 >> 5) & 1);
                auVar56._20_4_ = (uint)bVar4 * auVar48._20_4_ | (uint)!bVar4 * auVar47._20_4_;
                bVar4 = (bool)((byte)(uVar35 >> 6) & 1);
                auVar56._24_4_ = (uint)bVar4 * auVar48._24_4_ | (uint)!bVar4 * auVar47._24_4_;
                bVar4 = (bool)((byte)(uVar35 >> 7) & 1);
                auVar56._28_4_ = (uint)bVar4 * auVar48._28_4_ | (uint)!bVar4 * auVar47._28_4_;
                bVar4 = (bool)((byte)(uVar35 >> 8) & 1);
                auVar56._32_4_ = (uint)bVar4 * auVar48._32_4_ | (uint)!bVar4 * auVar47._32_4_;
                bVar4 = (bool)((byte)(uVar35 >> 9) & 1);
                auVar56._36_4_ = (uint)bVar4 * auVar48._36_4_ | (uint)!bVar4 * auVar47._36_4_;
                bVar4 = (bool)((byte)(uVar35 >> 10) & 1);
                auVar56._40_4_ = (uint)bVar4 * auVar48._40_4_ | (uint)!bVar4 * auVar47._40_4_;
                bVar4 = (bool)((byte)(uVar35 >> 0xb) & 1);
                auVar56._44_4_ = (uint)bVar4 * auVar48._44_4_ | (uint)!bVar4 * auVar47._44_4_;
                bVar4 = (bool)((byte)(uVar35 >> 0xc) & 1);
                auVar56._48_4_ = (uint)bVar4 * auVar48._48_4_ | (uint)!bVar4 * auVar47._48_4_;
                bVar4 = (bool)((byte)(uVar35 >> 0xd) & 1);
                auVar56._52_4_ = (uint)bVar4 * auVar48._52_4_ | (uint)!bVar4 * auVar47._52_4_;
                bVar4 = (bool)((byte)(uVar35 >> 0xe) & 1);
                auVar56._56_4_ = (uint)bVar4 * auVar48._56_4_ | (uint)!bVar4 * auVar47._56_4_;
                bVar4 = SUB81(uVar35 >> 0xf,0);
                auVar56._60_4_ = (uint)bVar4 * auVar48._60_4_ | (uint)!bVar4 * auVar47._60_4_;
                uVar29 = uVar3;
                if (uVar31 != 8) {
                  *puVar32 = uVar31;
                  puVar32 = puVar32 + 1;
                  *pauVar33 = auVar46;
                  pauVar33 = pauVar33 + 1;
                }
              }
              auVar46 = auVar56;
              uVar31 = uVar29;
            }
            auVar44 = auVar46;
          } while (uVar31 != 8);
        }
        goto LAB_01ebdb2e;
      }
LAB_01ebde89:
      local_4734 = local_4734 & (uint)uVar34;
      auVar37 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar4 = (bool)((byte)local_4734 & 1);
      bVar5 = (bool)((byte)(local_4734 >> 1) & 1);
      bVar6 = (bool)((byte)(local_4734 >> 2) & 1);
      bVar7 = (bool)((byte)(local_4734 >> 3) & 1);
      bVar8 = (bool)((byte)(local_4734 >> 4) & 1);
      bVar9 = (bool)((byte)(local_4734 >> 5) & 1);
      bVar10 = (bool)((byte)(local_4734 >> 6) & 1);
      bVar11 = (bool)((byte)(local_4734 >> 7) & 1);
      bVar13 = (bool)((byte)(local_4734 >> 8) & 1);
      bVar14 = (bool)((byte)(local_4734 >> 9) & 1);
      bVar15 = (bool)((byte)(local_4734 >> 10) & 1);
      bVar16 = (bool)((byte)(local_4734 >> 0xb) & 1);
      bVar17 = (bool)((byte)(local_4734 >> 0xc) & 1);
      bVar18 = (bool)((byte)(local_4734 >> 0xd) & 1);
      bVar19 = (bool)((byte)(local_4734 >> 0xe) & 1);
      bVar20 = (bool)((byte)(local_4734 >> 0xf) & 1);
      *(uint *)(ray + 0x200) = (uint)bVar4 * auVar37._0_4_ | (uint)!bVar4 * *(int *)(ray + 0x200);
      *(uint *)(ray + 0x204) = (uint)bVar5 * auVar37._4_4_ | (uint)!bVar5 * *(int *)(ray + 0x204);
      *(uint *)(ray + 0x208) = (uint)bVar6 * auVar37._8_4_ | (uint)!bVar6 * *(int *)(ray + 0x208);
      *(uint *)(ray + 0x20c) = (uint)bVar7 * auVar37._12_4_ | (uint)!bVar7 * *(int *)(ray + 0x20c);
      *(uint *)(ray + 0x210) = (uint)bVar8 * auVar37._16_4_ | (uint)!bVar8 * *(int *)(ray + 0x210);
      *(uint *)(ray + 0x214) = (uint)bVar9 * auVar37._20_4_ | (uint)!bVar9 * *(int *)(ray + 0x214);
      *(uint *)(ray + 0x218) = (uint)bVar10 * auVar37._24_4_ | (uint)!bVar10 * *(int *)(ray + 0x218)
      ;
      *(uint *)(ray + 0x21c) = (uint)bVar11 * auVar37._28_4_ | (uint)!bVar11 * *(int *)(ray + 0x21c)
      ;
      *(uint *)(ray + 0x220) = (uint)bVar13 * auVar37._32_4_ | (uint)!bVar13 * *(int *)(ray + 0x220)
      ;
      *(uint *)(ray + 0x224) = (uint)bVar14 * auVar37._36_4_ | (uint)!bVar14 * *(int *)(ray + 0x224)
      ;
      *(uint *)(ray + 0x228) = (uint)bVar15 * auVar37._40_4_ | (uint)!bVar15 * *(int *)(ray + 0x228)
      ;
      *(uint *)(ray + 0x22c) = (uint)bVar16 * auVar37._44_4_ | (uint)!bVar16 * *(int *)(ray + 0x22c)
      ;
      *(uint *)(ray + 0x230) = (uint)bVar17 * auVar37._48_4_ | (uint)!bVar17 * *(int *)(ray + 0x230)
      ;
      *(uint *)(ray + 0x234) = (uint)bVar18 * auVar37._52_4_ | (uint)!bVar18 * *(int *)(ray + 0x234)
      ;
      *(uint *)(ray + 0x238) = (uint)bVar19 * auVar37._56_4_ | (uint)!bVar19 * *(int *)(ray + 0x238)
      ;
      *(uint *)(ray + 0x23c) = (uint)bVar20 * auVar37._60_4_ | (uint)!bVar20 * *(int *)(ray + 0x23c)
      ;
    }
  }
  return;
  while( true ) {
    local_4708.geomID = *(uint *)((uVar31 & 0xfffffffffffffff0) + lVar27 * 8);
    local_46d8 = (context->scene->geometries).items[local_4708.geomID].ptr;
    auVar44 = vpbroadcastd_avx512f(ZEXT416(local_46d8->mask));
    uVar21 = vptestmd_avx512f(auVar44,*(undefined1 (*) [64])(ray + 0x240));
    uVar26 = (ushort)uVar21 & (ushort)uVar28;
    if (uVar26 == 0) {
      uVar26 = 0xffff;
    }
    else {
      local_4708.primID = *(uint *)((uVar31 & 0xfffffffffffffff0) + 4 + lVar27 * 8);
      auVar37 = vpmovm2d_avx512dq((ulong)uVar26);
      local_44c0 = vmovdqa64_avx512f(auVar37);
      local_4708.valid = (int *)local_44c0;
      local_4708.geometryUserPtr = local_46d8->userPtr;
      local_4708.context = context->user;
      local_4708.N = 0x10;
      local_46d0 = 0;
      local_46c8 = context->args;
      p_Var25 = local_46c8->intersect;
      if (p_Var25 == (RTCIntersectFunctionN)0x0) {
        p_Var25 = (RTCIntersectFunctionN)
                  local_46d8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      }
      local_4708.rayhit = (RTCRayHitN *)ray;
      (*p_Var25)(&local_4708);
      uVar21 = vcmpps_avx512f(ZEXT1664((undefined1  [16])0x0),*(undefined1 (*) [64])(ray + 0x200),10
                             );
      uVar26 = (ushort)uVar21;
      auVar45 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      auVar37 = local_4540;
      auVar41 = local_4580;
      auVar72 = local_45c0;
      auVar42 = local_4600;
      auVar38 = local_4500;
      auVar39 = local_4640;
      auVar40 = local_4680;
      auVar43 = local_46c0;
    }
    lVar27 = lVar27 + 1;
    uVar26 = (ushort)uVar28 & uVar26;
    uVar28 = (uint)uVar26;
    if (uVar26 == 0) break;
LAB_01ebdd23:
    if ((ulong)(uVar30 & 0xf) - 8 == lVar27) goto LAB_01ebde5a;
  }
  uVar28 = 0;
LAB_01ebde5a:
  local_4734 = local_4734 | ~uVar28;
  if ((short)local_4734 == -1) {
    local_4734 = 0xffff;
    goto LAB_01ebde89;
  }
  auVar44 = vbroadcastss_avx512f(ZEXT416(0xff800000));
  bVar4 = (bool)((byte)local_4734 & 1);
  auVar46._0_4_ = (uint)bVar4 * auVar44._0_4_ | (uint)!bVar4 * auVar38._0_4_;
  bVar4 = (bool)((byte)(local_4734 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar4 * auVar44._4_4_ | (uint)!bVar4 * auVar38._4_4_;
  bVar4 = (bool)((byte)(local_4734 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar4 * auVar44._8_4_ | (uint)!bVar4 * auVar38._8_4_;
  bVar4 = (bool)((byte)(local_4734 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar4 * auVar44._12_4_ | (uint)!bVar4 * auVar38._12_4_;
  bVar4 = (bool)((byte)(local_4734 >> 4) & 1);
  auVar46._16_4_ = (uint)bVar4 * auVar44._16_4_ | (uint)!bVar4 * auVar38._16_4_;
  bVar4 = (bool)((byte)(local_4734 >> 5) & 1);
  auVar46._20_4_ = (uint)bVar4 * auVar44._20_4_ | (uint)!bVar4 * auVar38._20_4_;
  bVar4 = (bool)((byte)(local_4734 >> 6) & 1);
  auVar46._24_4_ = (uint)bVar4 * auVar44._24_4_ | (uint)!bVar4 * auVar38._24_4_;
  bVar4 = (bool)((byte)(local_4734 >> 7) & 1);
  auVar46._28_4_ = (uint)bVar4 * auVar44._28_4_ | (uint)!bVar4 * auVar38._28_4_;
  bVar4 = (bool)((byte)(local_4734 >> 8) & 1);
  auVar46._32_4_ = (uint)bVar4 * auVar44._32_4_ | (uint)!bVar4 * auVar38._32_4_;
  bVar4 = (bool)((byte)(local_4734 >> 9) & 1);
  auVar46._36_4_ = (uint)bVar4 * auVar44._36_4_ | (uint)!bVar4 * auVar38._36_4_;
  bVar4 = (bool)((byte)(local_4734 >> 10) & 1);
  auVar46._40_4_ = (uint)bVar4 * auVar44._40_4_ | (uint)!bVar4 * auVar38._40_4_;
  bVar4 = (bool)((byte)(local_4734 >> 0xb) & 1);
  auVar46._44_4_ = (uint)bVar4 * auVar44._44_4_ | (uint)!bVar4 * auVar38._44_4_;
  bVar4 = (bool)((byte)(local_4734 >> 0xc) & 1);
  auVar46._48_4_ = (uint)bVar4 * auVar44._48_4_ | (uint)!bVar4 * auVar38._48_4_;
  bVar4 = (bool)((byte)(local_4734 >> 0xd) & 1);
  auVar46._52_4_ = (uint)bVar4 * auVar44._52_4_ | (uint)!bVar4 * auVar38._52_4_;
  bVar4 = (bool)((byte)(local_4734 >> 0xe) & 1);
  auVar46._56_4_ = (uint)bVar4 * auVar44._56_4_ | (uint)!bVar4 * auVar38._56_4_;
  bVar4 = (bool)((byte)(local_4734 >> 0xf) & 1);
  auVar46._60_4_ = (uint)bVar4 * auVar44._60_4_ | (uint)!bVar4 * auVar38._60_4_;
  auVar38 = auVar46;
  goto LAB_01ebdb2e;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }